

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_x86.c
# Opt level: O1

__m128i aes_decrypt_x86(__m128i input,__m128i *key,int nr)

{
  undefined1 in_XMM0 [16];
  undefined1 auVar1 [16];
  __m128i alVar2;
  
  auVar1 = aesdec(in_XMM0 ^ *(undefined1 (*) [16])input[0],*(undefined1 (*) [16])(input[0] + 0x10));
  auVar1 = aesdec(auVar1,*(undefined1 (*) [16])(input[0] + 0x20));
  auVar1 = aesdec(auVar1,*(undefined1 (*) [16])(input[0] + 0x30));
  auVar1 = aesdec(auVar1,*(undefined1 (*) [16])(input[0] + 0x40));
  auVar1 = aesdec(auVar1,*(undefined1 (*) [16])(input[0] + 0x50));
  auVar1 = aesdec(auVar1,*(undefined1 (*) [16])(input[0] + 0x60));
  auVar1 = aesdec(auVar1,*(undefined1 (*) [16])(input[0] + 0x70));
  auVar1 = aesdec(auVar1,*(undefined1 (*) [16])(input[0] + 0x80));
  auVar1 = aesdec(auVar1,*(undefined1 (*) [16])(input[0] + 0x90));
  if (10 < (int)input[1]) {
    auVar1 = aesdec(auVar1,*(undefined1 (*) [16])(input[0] + 0xa0));
    auVar1 = aesdec(auVar1,*(undefined1 (*) [16])(input[0] + 0xb0));
    auVar1 = aesdec(auVar1,*(undefined1 (*) [16])(input[0] + 0xc0));
    auVar1 = aesdec(auVar1,*(undefined1 (*) [16])(input[0] + 0xd0));
  }
  alVar2[0] = (long)(int)input[1] * 0x10;
  aesdeclast(auVar1,*(undefined1 (*) [16])(input[0] + alVar2[0]));
  alVar2[1] = (longlong)key;
  return alVar2;
}

Assistant:

static __m128i aes_decrypt_x86(__m128i input, const __m128i* key, int nr)
{
  __m128i tmp;
  tmp = _mm_xor_si128(input, _mm_load_si128(key + 0));
  tmp = _mm_aesdec_si128(tmp, _mm_load_si128(key + 1));
  tmp = _mm_aesdec_si128(tmp, _mm_load_si128(key + 2));
  tmp = _mm_aesdec_si128(tmp, _mm_load_si128(key + 3));
  tmp = _mm_aesdec_si128(tmp, _mm_load_si128(key + 4));
  tmp = _mm_aesdec_si128(tmp, _mm_load_si128(key + 5));
  tmp = _mm_aesdec_si128(tmp, _mm_load_si128(key + 6));
  tmp = _mm_aesdec_si128(tmp, _mm_load_si128(key + 7));
  tmp = _mm_aesdec_si128(tmp, _mm_load_si128(key + 8));
  tmp = _mm_aesdec_si128(tmp, _mm_load_si128(key + 9));
  if (nr > 10)
  {
    tmp = _mm_aesdec_si128(tmp, _mm_load_si128(key + 10));
    tmp = _mm_aesdec_si128(tmp, _mm_load_si128(key + 11));
    tmp = _mm_aesdec_si128(tmp, _mm_load_si128(key + 12));
    tmp = _mm_aesdec_si128(tmp, _mm_load_si128(key + 13));
  }
  return _mm_aesdeclast_si128(tmp, _mm_load_si128(key + nr));
}